

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_compress.c
# Opt level: O0

size_t libdeflate_zlib_compress
                 (libdeflate_compressor *c,void *in,size_t in_nbytes,void *out,
                 size_t out_nbytes_avail)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  uint32_t uVar4;
  size_t sVar5;
  uint *puVar6;
  ushort *in_RCX;
  void *in_RDX;
  libdeflate_compressor *in_RSI;
  libdeflate_compressor *in_RDI;
  void *in_R8;
  size_t deflate_size;
  uint level_hint;
  uint compression_level;
  u16 hdr;
  u8 *out_next;
  void *in_stack_ffffffffffffff68;
  ushort *out_nbytes_avail_00;
  ushort *in_nbytes_00;
  size_t local_48;
  
  if (in_R8 < (void *)0x7) {
    local_48 = 0;
  }
  else {
    in_nbytes_00 = in_RCX;
    uVar3 = libdeflate_get_compression_level(in_RDI);
    if (uVar3 < 2) {
      sVar1 = 0;
    }
    else if (uVar3 < 6) {
      sVar1 = 1;
    }
    else if (uVar3 < 8) {
      sVar1 = 2;
    }
    else {
      sVar1 = 3;
    }
    uVar2 = sVar1 << 6 | 0x7800;
    uVar2 = uVar2 | 0x1f - uVar2 % 0x1f;
    *in_RCX = uVar2 << 8 | uVar2 >> 8;
    out_nbytes_avail_00 = in_RCX + 1;
    sVar5 = libdeflate_deflate_compress
                      (in_RSI,in_RDX,(size_t)in_nbytes_00,in_R8,(size_t)out_nbytes_avail_00);
    if (sVar5 == 0) {
      local_48 = 0;
    }
    else {
      puVar6 = (uint *)(sVar5 + (long)out_nbytes_avail_00);
      uVar4 = libdeflate_adler32((u32)sVar5,in_stack_ffffffffffffff68,0x12ba54);
      *puVar6 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      local_48 = (long)puVar6 + (4 - (long)in_nbytes_00);
    }
  }
  return local_48;
}

Assistant:

LIBDEFLATEAPI size_t
libdeflate_zlib_compress(struct libdeflate_compressor *c,
			 const void *in, size_t in_nbytes,
			 void *out, size_t out_nbytes_avail)
{
	u8 *out_next = out;
	u16 hdr;
	unsigned compression_level;
	unsigned level_hint;
	size_t deflate_size;

	if (out_nbytes_avail <= ZLIB_MIN_OVERHEAD)
		return 0;

	/* 2 byte header: CMF and FLG  */
	hdr = (ZLIB_CM_DEFLATE << 8) | (ZLIB_CINFO_32K_WINDOW << 12);
	compression_level = libdeflate_get_compression_level(c);
	if (compression_level < 2)
		level_hint = ZLIB_FASTEST_COMPRESSION;
	else if (compression_level < 6)
		level_hint = ZLIB_FAST_COMPRESSION;
	else if (compression_level < 8)
		level_hint = ZLIB_DEFAULT_COMPRESSION;
	else
		level_hint = ZLIB_SLOWEST_COMPRESSION;
	hdr |= level_hint << 6;
	hdr |= 31 - (hdr % 31);

	put_unaligned_be16(hdr, out_next);
	out_next += 2;

	/* Compressed data  */
	deflate_size = libdeflate_deflate_compress(c, in, in_nbytes, out_next,
					out_nbytes_avail - ZLIB_MIN_OVERHEAD);
	if (deflate_size == 0)
		return 0;
	out_next += deflate_size;

	/* ADLER32  */
	put_unaligned_be32(libdeflate_adler32(1, in, in_nbytes), out_next);
	out_next += 4;

	return out_next - (u8 *)out;
}